

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkToBarBufs(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pObj_00;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar6;
  int local_460;
  int nBoxes;
  int k;
  int i;
  Abc_Obj_t *pLoMap;
  Abc_Obj_t *pLiMap;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObjLo;
  Abc_Obj_t *pObjLi;
  Abc_Obj_t *pLatch;
  Abc_Ntk_t *pTemp;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *vLoMaps;
  Vec_Ptr_t *vLiMaps;
  char Buffer [1000];
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                  ,0xbc,"Abc_Ntk_t *Abc_NtkToBarBufs(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkCheckSingleInstance(pNtk);
  if (iVar1 == 0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    if (pNtk->pDesign == (Abc_Des_t *)0x0) {
      __assert_fail("pNtk->pDesign != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                    ,0xbf,"Abc_Ntk_t *Abc_NtkToBarBufs(Abc_Ntk_t *)");
    }
    pNtk_local = Abc_NtkAlloc(ABC_NTK_LOGIC,pNtk->ntkFunc,1);
    pcVar3 = Extra_UtilStrsav(pNtk->pName);
    pNtk_local->pName = pcVar3;
    pcVar3 = Extra_UtilStrsav(pNtk->pSpec);
    pNtk_local->pSpec = pcVar3;
    Abc_NtkCleanCopy_rec(pNtk);
    for (nBoxes = 0; iVar1 = Abc_NtkPiNum(pNtk), nBoxes < iVar1; nBoxes = nBoxes + 1) {
      pAVar4 = Abc_NtkPi(pNtk,nBoxes);
      pAVar6 = Abc_NtkDupObj(pNtk_local,pAVar4,1);
      pAVar4 = Abc_ObjFanout0(pAVar4);
      (pAVar4->field_6).pCopy = pAVar6;
    }
    for (nBoxes = 0; iVar1 = Abc_NtkPoNum(pNtk), nBoxes < iVar1; nBoxes = nBoxes + 1) {
      pAVar4 = Abc_NtkPo(pNtk,nBoxes);
      Abc_NtkDupObj(pNtk_local,pAVar4,1);
    }
    uVar2 = Abc_NtkCollectPiPos(pNtk,&vLoMaps,(Vec_Ptr_t **)&pNtkNew);
    for (nBoxes = 0; iVar1 = Vec_PtrSize(vLoMaps), nBoxes < iVar1; nBoxes = nBoxes + 1) {
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(vLoMaps,nBoxes);
      pAVar6 = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pNtkNew,nBoxes);
      pFanin = Abc_NtkCreateBi(pNtk_local);
      pAVar5 = Abc_NtkCreateLatch(pNtk_local);
      pObj_00 = Abc_NtkCreateBo(pNtk_local);
      Abc_ObjAddFanin(pAVar5,pFanin);
      Abc_ObjAddFanin(pObj_00,pAVar5);
      pAVar5->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
      pAVar5 = Abc_ObjFanin0(pAVar4);
      if (pAVar5->pNtk == pNtk) {
        pAVar5 = Abc_ObjFanout0(pAVar6);
        if (pAVar5->pNtk == pNtk) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                        ,0xd9,"Abc_Ntk_t *Abc_NtkToBarBufs(Abc_Ntk_t *)");
        }
        pAVar5 = Abc_ObjFanout0(pAVar6);
        pLatch = (Abc_Obj_t *)pAVar5->pNtk;
      }
      else {
        pAVar5 = Abc_ObjFanin0(pAVar4);
        pLatch = (Abc_Obj_t *)pAVar5->pNtk;
      }
      pcVar3 = Abc_NtkName((Abc_Ntk_t *)pLatch);
      sprintf((char *)&vLiMaps,"_%s_in",pcVar3);
      pAVar5 = Abc_ObjFanin0(pAVar4);
      pcVar3 = Abc_ObjName(pAVar5);
      Abc_ObjAssignName(pFanin,pcVar3,(char *)&vLiMaps);
      pcVar3 = Abc_NtkName((Abc_Ntk_t *)pLatch);
      sprintf((char *)&vLiMaps,"_%s_out",pcVar3);
      pAVar5 = Abc_ObjFanout0(pAVar6);
      pcVar3 = Abc_ObjName(pAVar5);
      Abc_ObjAssignName(pObj_00,pcVar3,(char *)&vLiMaps);
      (pAVar4->field_6).pCopy = pFanin;
      pAVar4 = Abc_ObjFanout0(pAVar6);
      (pAVar4->field_6).pCopy = pObj_00;
      pAVar4 = Abc_ObjFanout0(pAVar6);
      iVar1 = Abc_ObjIsNet(pAVar4);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNet(Abc_ObjFanout0(pLoMap))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                      ,0xe0,"Abc_Ntk_t *Abc_NtkToBarBufs(Abc_Ntk_t *)");
      }
    }
    Vec_PtrFree(vLoMaps);
    Vec_PtrFree((Vec_Ptr_t *)pNtkNew);
    for (nBoxes = 0; iVar1 = Vec_PtrSize(pNtk->pDesign->vModules), nBoxes < iVar1;
        nBoxes = nBoxes + 1) {
      pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(pNtk->pDesign->vModules,nBoxes);
      for (local_460 = 0; iVar1 = Abc_NtkCoNum(pNtk_00), local_460 < iVar1;
          local_460 = local_460 + 1) {
        pAVar6 = Abc_NtkCo(pNtk_00,local_460);
        pAVar4 = (pAVar6->field_6).pCopy;
        pAVar6 = Abc_ObjFanin0(pAVar6);
        pAVar6 = Abc_NtkToBarBufs_rec(pNtk_local,pAVar6);
        Abc_ObjAddFanin(pAVar4,pAVar6);
      }
    }
    iVar1 = Abc_NtkLatchNum(pNtk_local);
    pNtk_local->nBarBufs = iVar1;
    printf("Hierarchy reader flattened %d instances of logic boxes and introduced %d barbufs.\n",
           (ulong)uVar2,(ulong)(uint)pNtk_local->nBarBufs);
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkToBarBufs( Abc_Ntk_t * pNtk )
{
    char Buffer[1000];
    Vec_Ptr_t * vLiMaps, * vLoMaps;
    Abc_Ntk_t * pNtkNew, * pTemp;
    Abc_Obj_t * pLatch, * pObjLi, * pObjLo;
    Abc_Obj_t * pObj, * pLiMap, * pLoMap;
    int i, k, nBoxes;
    assert( Abc_NtkIsNetlist(pNtk) );
    if ( !Abc_NtkCheckSingleInstance(pNtk) )
        return NULL;
    assert( pNtk->pDesign != NULL );
    // start the network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_LOGIC, pNtk->ntkFunc, 1 );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clone CIs/CIs/boxes
    Abc_NtkCleanCopy_rec( pNtk );
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_ObjFanout0(pObj)->pCopy = Abc_NtkDupObj( pNtkNew, pObj, 1 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    // create latches and transfer copy labels
    nBoxes = Abc_NtkCollectPiPos( pNtk, &vLiMaps, &vLoMaps );
    Vec_PtrForEachEntryTwo( Abc_Obj_t *, vLiMaps, Abc_Obj_t *, vLoMaps, pLiMap, pLoMap, i )
    {
        pObjLi = Abc_NtkCreateBi(pNtkNew);
        pLatch = Abc_NtkCreateLatch(pNtkNew);
        pObjLo = Abc_NtkCreateBo(pNtkNew);
        Abc_ObjAddFanin( pLatch, pObjLi );
        Abc_ObjAddFanin( pObjLo, pLatch );
        pLatch->pData = (void *)ABC_INIT_ZERO;
        pTemp = NULL;
        if ( Abc_ObjFanin0(pLiMap)->pNtk != pNtk )
            pTemp = Abc_ObjFanin0(pLiMap)->pNtk;
        else if ( Abc_ObjFanout0(pLoMap)->pNtk != pNtk )
            pTemp = Abc_ObjFanout0(pLoMap)->pNtk;
        else assert( 0 );
        sprintf( Buffer, "_%s_in", Abc_NtkName(pTemp) );
        Abc_ObjAssignName( pObjLi, Abc_ObjName(Abc_ObjFanin0(pLiMap)), Buffer );
        sprintf( Buffer, "_%s_out", Abc_NtkName(pTemp) );
        Abc_ObjAssignName( pObjLo, Abc_ObjName(Abc_ObjFanout0(pLoMap)), Buffer );
        pLiMap->pCopy = pObjLi;
        Abc_ObjFanout0(pLoMap)->pCopy = pObjLo;
        assert( Abc_ObjIsNet(Abc_ObjFanout0(pLoMap)) );
    }
    Vec_PtrFree( vLiMaps );
    Vec_PtrFree( vLoMaps );
    // rebuild networks
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pTemp, i )
        Abc_NtkForEachCo( pTemp, pObj, k )
            Abc_ObjAddFanin( pObj->pCopy, Abc_NtkToBarBufs_rec(pNtkNew, Abc_ObjFanin0(pObj)) );
    pNtkNew->nBarBufs = Abc_NtkLatchNum(pNtkNew);
    printf( "Hierarchy reader flattened %d instances of logic boxes and introduced %d barbufs.\n", nBoxes, pNtkNew->nBarBufs );
    return pNtkNew;
}